

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImBezierCubicClosestPointCasteljauStep
               (ImVec2 *p,ImVec2 *p_closest,ImVec2 *p_last,float *p_closest_dist2,float x1,float y1,
               float x2,float y2,float x3,float y3,float x4,float y4,float tess_tol,int level)

{
  ImVec2 IVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  
  while( true ) {
    fVar4 = x4 - x1;
    fVar5 = y4 - y1;
    fVar6 = (x2 - x4) * fVar5 - (y2 - y4) * fVar4;
    fVar7 = (x3 - x4) * fVar5 - (y3 - y4) * fVar4;
    uVar2 = -(uint)(-fVar6 <= fVar6);
    uVar3 = -(uint)(-fVar7 <= fVar7);
    fVar6 = (float)(~uVar3 & (uint)-fVar7 | (uint)fVar7 & uVar3) +
            (float)(~uVar2 & (uint)-fVar6 | (uint)fVar6 & uVar2);
    if (fVar6 * fVar6 < (fVar4 * fVar4 + fVar5 * fVar5) * tess_tol) {
      fVar4 = p_last->x;
      fVar5 = p_last->y;
      fVar9 = x4 - fVar4;
      fVar7 = y4 - fVar5;
      fVar6 = (p->x - fVar4) * fVar9 + (p->y - fVar5) * fVar7;
      if (0.0 <= fVar6) {
        fVar10 = fVar9 * fVar9 + fVar7 * fVar7;
        IVar8.y = y4;
        IVar8.x = x4;
        if (fVar6 <= fVar10) {
          IVar8.y = fVar5 + (fVar7 * fVar6) / fVar10;
          IVar8.x = fVar4 + (fVar9 * fVar6) / fVar10;
        }
      }
      else {
        IVar8 = *p_last;
      }
      fVar4 = p->x - IVar8.x;
      fVar5 = p->y - IVar8.y;
      fVar4 = fVar4 * fVar4 + fVar5 * fVar5;
      if (fVar4 < *p_closest_dist2) {
        *p_closest = IVar8;
        *p_closest_dist2 = fVar4;
      }
      IVar1.y = y4;
      IVar1.x = x4;
      *p_last = IVar1;
      return;
    }
    if (9 < level) break;
    fVar4 = (x1 + x2) * 0.5;
    fVar5 = (y1 + y2) * 0.5;
    fVar10 = (x2 + x3) * 0.5;
    fVar9 = (y2 + y3) * 0.5;
    x3 = (x3 + x4) * 0.5;
    y3 = (y3 + y4) * 0.5;
    fVar6 = (fVar4 + fVar10) * 0.5;
    fVar7 = (fVar5 + fVar9) * 0.5;
    x2 = (fVar10 + x3) * 0.5;
    y2 = (fVar9 + y3) * 0.5;
    fVar9 = (fVar6 + x2) * 0.5;
    fVar10 = (fVar7 + y2) * 0.5;
    level = level + 1;
    ImBezierCubicClosestPointCasteljauStep
              (p,p_closest,p_last,p_closest_dist2,x1,y1,fVar4,fVar5,fVar6,fVar7,fVar9,fVar10,
               tess_tol,level);
    x1 = fVar9;
    y1 = fVar10;
  }
  return;
}

Assistant:

static void ImBezierCubicClosestPointCasteljauStep(const ImVec2& p, ImVec2& p_closest, ImVec2& p_last, float& p_closest_dist2, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        ImVec2 p_current(x4, y4);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}